

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall Rml::DataViewValue::DataViewValue(DataViewValue *this,Element *element)

{
  allocator<char> local_39;
  String local_38;
  Element *local_18;
  Element *element_local;
  DataViewValue *this_local;
  
  local_18 = element;
  element_local = (Element *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"value",&local_39);
  DataViewAttribute::DataViewAttribute(&this->super_DataViewAttribute,element,&local_38,100);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  (this->super_DataViewAttribute).super_DataViewCommon.super_DataView.super_Releasable.
  _vptr_Releasable = (_func_int **)&PTR__DataViewValue_00815828;
  return;
}

Assistant:

DataViewValue::DataViewValue(Element* element) : DataViewAttribute(element, "value", SortOffset_DataValue) {}